

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.hpp
# Opt level: O0

uint16_t __thiscall libtorrent::aux::session_impl::session_time(session_impl *this)

{
  unsigned_short uVar1;
  int64_t iVar2;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_30;
  rep local_28;
  long local_20;
  int64_t ret;
  session_impl *this_local;
  
  ret = (int64_t)this;
  local_30.__d.__r = (duration)time_now();
  local_28 = (rep)::std::chrono::operator-(&local_30,&this->m_created);
  iVar2 = total_seconds<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                    ((duration<long,_std::ratio<1L,_1000000000L>_>)local_28);
  local_20 = iVar2 + 1;
  uVar1 = ::std::numeric_limits<unsigned_short>::max();
  if ((long)(ulong)uVar1 < iVar2 + 1) {
    this_local._6_2_ = ::std::numeric_limits<unsigned_short>::max();
  }
  else {
    this_local._6_2_ = (unsigned_short)local_20;
  }
  return this_local._6_2_;
}

Assistant:

std::uint16_t session_time() const override
			{
				// +1 is here to make it possible to distinguish uninitialized (to
				// 0) timestamps and timestamps of things that happened during the
				// first second after the session was constructed
				std::int64_t const ret = total_seconds(aux::time_now()
					- m_created) + 1;
				TORRENT_ASSERT(ret >= 0);
				if (ret > (std::numeric_limits<std::uint16_t>::max)())
					return (std::numeric_limits<std::uint16_t>::max)();
				return static_cast<std::uint16_t>(ret);
			}